

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cc
# Opt level: O2

void __thiscall
tchecker::zg::path::concrete::edge_t::edge_t
          (edge_t *this,const_transition_sptr_t *t,clock_rational_value_t delay)

{
  type_conflict tVar1;
  invalid_argument *this_00;
  int local_2c;
  clock_rational_value_t delay_local;
  
  delay_local.den = delay.den;
  delay_local.num = delay.num;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
  ::intrusive_shared_ptr_t
            ((intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>
              *)this,t);
  (this->_delay).num = delay_local.num;
  (this->_delay).den = delay_local.den;
  local_2c = 0;
  tVar1 = boost::rational<long>::operator<(&delay_local,&local_2c);
  if (!tVar1) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"negative delay is not allowed");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

edge_t::edge_t(tchecker::zg::const_transition_sptr_t const & t, tchecker::clock_rational_value_t delay)
    : tchecker::zg::path::symbolic::edge_t(t), _delay(delay)
{
  if (delay < 0)
    throw std::invalid_argument("negative delay is not allowed");
}